

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O1

void emit_ARB1_attribute(Context *ctx,RegisterType regtype,int regnum,MOJOSHADER_usage usage,
                        int index,int wmask,int flags)

{
  uint uVar1;
  bool bVar2;
  RegisterType RVar3;
  char *pcVar4;
  long lVar5;
  byte bVar6;
  char *pcVar7;
  char *fmt;
  undefined4 in_register_00000084;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char index_str [16];
  char varname [64];
  char regnum_str [16];
  
  pcVar10 = index_str;
  pcVar7 = index_str;
  index_str[0] = '\0';
  index_str[1] = '\0';
  index_str[2] = '\0';
  index_str[3] = '\0';
  index_str[4] = '\0';
  index_str[5] = '\0';
  index_str[6] = '\0';
  index_str[7] = '\0';
  index_str[8] = '\0';
  index_str[9] = '\0';
  index_str[10] = '\0';
  index_str[0xb] = '\0';
  index_str[0xc] = '\0';
  index_str[0xd] = '\0';
  index_str[0xe] = '\0';
  index_str[0xf] = '\0';
  pcVar4 = get_D3D_register_string
                     (ctx,regtype,regnum,regnum_str,CONCAT44(in_register_00000084,index));
  snprintf(varname,0x40,"%s%s",pcVar4,regnum_str);
  if (index != 0) {
    snprintf(index_str,0x10,"%u",(ulong)(uint)index);
  }
  if (ctx->shader_type == MOJOSHADER_TYPE_PIXEL) {
    if ((flags & 4U) == 0) {
      pcVar4 = "ATTRIB";
    }
    else {
      if (ctx->profile_supports_nv4 == 0) {
        pcVar4 = ctx->profile->name;
        pcVar7 = "centroid unsupported in %s profile";
        goto LAB_0010e6da;
      }
      pcVar4 = "CENTROID ATTRIB";
    }
    pcVar7 = "";
    if (regtype == REG_TYPE_DEPTHOUT) {
      pcVar9 = "result.depth";
LAB_0010e633:
      bVar2 = false;
      pcVar4 = "OUTPUT";
    }
    else if (regtype == REG_TYPE_COLOROUT) {
      pcVar9 = "result.color";
      if (ctx->have_multi_color_outputs == 0) goto LAB_0010e633;
      bVar2 = false;
      snprintf(index_str,0x10,"%u",(ulong)(uint)regnum);
      pcVar7 = "[";
      pcVar4 = "OUTPUT";
    }
    else if ((regtype & ~REG_TYPE_CONST) == REG_TYPE_INPUT) {
      bVar2 = true;
      if (usage != MOJOSHADER_USAGE_COLOR) {
        if (usage == MOJOSHADER_USAGE_TEXCOORD) {
          bVar6 = ctx->minor_ver;
          pcVar9 = (char *)0x0;
          if (bVar6 == 0xff) {
            bVar6 = 0;
          }
          if (0x10003 < ((uint)bVar6 | (uint)ctx->major_ver << 0x10)) {
            bVar2 = false;
            snprintf(index_str,0x10,"%u",(ulong)(uint)index);
            pcVar7 = "[";
            pcVar9 = "fragment.texcoord";
          }
        }
        else {
          pcVar9 = (char *)0x0;
        }
        goto LAB_0010e8e1;
      }
      index_str._0_8_ = (ulong)(uint7)index_str._1_7_ << 8;
      if (index == 0) {
        pcVar9 = "fragment.color.primary";
      }
      else {
        if (index != 1) {
          failf(ctx,"%s","unsupported color index");
          goto LAB_0010e8db;
        }
        pcVar9 = "fragment.color.secondary";
      }
LAB_0010e880:
      bVar2 = false;
    }
    else {
      if (regtype == REG_TYPE_MISCTYPE) {
        if (regnum == 0) {
          index_str._0_8_ = (ulong)(uint7)index_str._1_7_ << 8;
          pcVar9 = "fragment.position";
          goto LAB_0010e880;
        }
        if (regnum == 1) {
          if (ctx->profile_supports_nv4 != 0) {
            index_str._0_8_ = (ulong)(uint7)index_str._1_7_ << 8;
            pcVar9 = "fragment.facing";
            goto LAB_0010e880;
          }
          pcVar7 = ctx->profile->name;
          pcVar9 = "vFace unsupported in %s profile";
        }
        else {
          pcVar9 = "%s";
          pcVar7 = "BUG: unhandled misc register";
        }
      }
      else {
        pcVar9 = "%s";
        pcVar7 = "unknown pixel shader attribute register";
      }
      failf(ctx,pcVar9,pcVar7);
LAB_0010e8db:
      pcVar9 = (char *)0x0;
      bVar2 = true;
      pcVar7 = "";
    }
LAB_0010e8e1:
    if (bVar2) {
      return;
    }
    push_output(ctx,&ctx->globals);
    fmt = "%s %s = %s%s%s%s;";
    pcVar8 = varname;
  }
  else {
    if (ctx->shader_type != MOJOSHADER_TYPE_VERTEX) {
      pcVar7 = "%s";
      pcVar4 = "Unknown shader type";
LAB_0010e6da:
      failf(ctx,pcVar7,pcVar4);
      return;
    }
    if (ctx->major_ver < 3) {
      if (regtype == REG_TYPE_OUTPUT) {
        usage = MOJOSHADER_USAGE_TEXCOORD;
        index = regnum;
      }
      else {
        RVar3 = REG_TYPE_OUTPUT;
        if (regtype == REG_TYPE_ATTROUT) {
          usage = MOJOSHADER_USAGE_COLOR;
          index = regnum;
          regtype = RVar3;
        }
        else if ((regtype == REG_TYPE_RASTOUT) &&
                (index = regnum, regtype = RVar3, (uint)regnum < 3)) {
          usage = *(MOJOSHADER_usage *)(&DAT_001354dc + (ulong)(uint)regnum * 4);
        }
      }
    }
    if (regtype != REG_TYPE_OUTPUT) {
      if (regtype != REG_TYPE_INPUT) {
        pcVar7 = "%s";
        pcVar4 = "unknown vertex shader attribute register";
        goto LAB_0010e6da;
      }
      uVar1 = ctx->assigned_vertex_attributes;
      ctx->assigned_vertex_attributes = uVar1 + 1;
      push_output(ctx,&ctx->globals);
      output_line(ctx,"ATTRIB %s = vertex.attrib[%d];",varname,(ulong)uVar1);
      goto LAB_0010e91f;
    }
    pcVar9 = "";
    bVar2 = true;
    pcVar8 = (char *)0x0;
    switch(usage) {
    case MOJOSHADER_USAGE_POSITION:
      ctx->arb1_wrote_position = 1;
      pcVar8 = "result.position";
      break;
    default:
      goto switchD_0010e601_caseD_1;
    case MOJOSHADER_USAGE_POINTSIZE:
      pcVar8 = "result.pointsize";
      break;
    case MOJOSHADER_USAGE_TEXCOORD:
      bVar2 = false;
      snprintf(index_str,0x10,"%u",(ulong)(uint)index);
      pcVar10 = "]";
      pcVar9 = "[";
      pcVar8 = "result.texcoord";
      goto LAB_0010e808;
    case MOJOSHADER_USAGE_COLOR:
      index_str._0_8_ = (ulong)(uint7)index_str._1_7_ << 8;
      if (index == 0) {
        pcVar8 = "result.color.primary";
      }
      else {
        if (index != 1) {
          pcVar8 = (char *)0x0;
          goto switchD_0010e601_caseD_1;
        }
        pcVar8 = "result.color.secondary";
      }
      break;
    case MOJOSHADER_USAGE_FOG:
      pcVar8 = "result.fogcoord";
    }
    bVar2 = false;
switchD_0010e601_caseD_1:
    pcVar10 = "";
LAB_0010e808:
    push_output(ctx,&ctx->globals);
    if (bVar2) {
      pcVar4 = "FLOAT TEMP";
      if (ctx->profile_supports_nv4 == 0) {
        pcVar4 = "TEMP";
      }
      output_line(ctx,"%s %s;",pcVar4,varname);
      goto LAB_0010e91f;
    }
    fmt = "OUTPUT %s = %s%s%s%s;";
    pcVar4 = varname;
  }
  output_line(ctx,fmt,pcVar4,pcVar8,pcVar9,pcVar7,pcVar10);
LAB_0010e91f:
  lVar5 = (long)ctx->output_stack_len;
  if (0 < lVar5) {
    ctx->output_stack_len = (int)(lVar5 - 1U);
    ctx->output = ctx->output_stack[lVar5 - 1U & 0xffffffff];
    ctx->indent = ctx->indent_stack[lVar5 + -1];
    return;
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_ARB1_attribute(Context *ctx, RegisterType regtype, int regnum,
                                MOJOSHADER_usage usage, int index, int wmask,
                                int flags)
{
    // !!! FIXME: this function doesn't deal with write masks at all yet!
    const char *usage_str = NULL;
    const char *arrayleft = "";
    const char *arrayright = "";
    char index_str[16] = { '\0' };

    char varname[64];
    get_ARB1_varname_in_buf(ctx, regtype, regnum, varname, sizeof (varname));

    //assert((flags & MOD_PP) == 0);  // !!! FIXME: is PP allowed?

    if (index != 0)  // !!! FIXME: a lot of these MUST be zero.
        snprintf(index_str, sizeof (index_str), "%u", (uint) index);

    if (shader_is_vertex(ctx))
    {
        // pre-vs3 output registers.
        // these don't ever happen in DCL opcodes, I think. Map to vs_3_*
        //  output registers.
        if (!shader_version_atleast(ctx, 3, 0))
        {
            if (regtype == REG_TYPE_RASTOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                index = regnum;
                switch ((const RastOutType) regnum)
                {
                    case RASTOUT_TYPE_POSITION:
                        usage = MOJOSHADER_USAGE_POSITION;
                        break;
                    case RASTOUT_TYPE_FOG:
                        usage = MOJOSHADER_USAGE_FOG;
                        break;
                    case RASTOUT_TYPE_POINT_SIZE:
                        usage = MOJOSHADER_USAGE_POINTSIZE;
                        break;
                } // switch
            } // if

            else if (regtype == REG_TYPE_ATTROUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_COLOR;
                index = regnum;
            } // else if

            else if (regtype == REG_TYPE_TEXCRDOUT)
            {
                regtype = REG_TYPE_OUTPUT;
                usage = MOJOSHADER_USAGE_TEXCOORD;
                index = regnum;
            } // else if
        } // if

        // to avoid limitations of various GL entry points for input
        // attributes (glSecondaryColorPointer() can only take 3 component
        // items, glVertexPointer() can't do GL_UNSIGNED_BYTE, many other
        // issues), we set up all inputs as generic vertex attributes, so we
        // can pass data in just about any form, and ignore the built-in GLSL
        // attributes like gl_SecondaryColor. Output needs to use the the
        // built-ins, though, but we don't have to worry about the GL entry
        // point limitations there.

        if (regtype == REG_TYPE_INPUT)
        {
            const int attr = ctx->assigned_vertex_attributes++;
            push_output(ctx, &ctx->globals);
            output_line(ctx, "ATTRIB %s = vertex.attrib[%d];", varname, attr);
            pop_output(ctx);
        } // if

        else if (regtype == REG_TYPE_OUTPUT)
        {
            switch (usage)
            {
                case MOJOSHADER_USAGE_POSITION:
                    ctx->arb1_wrote_position = 1;
                    usage_str = "result.position";
                    break;
                case MOJOSHADER_USAGE_POINTSIZE:
                    usage_str = "result.pointsize";
                    break;
                case MOJOSHADER_USAGE_COLOR:
                    index_str[0] = '\0';  // no explicit number.
                    if (index == 0)
                        usage_str = "result.color.primary";
                    else if (index == 1)
                        usage_str = "result.color.secondary";
                    break;
                case MOJOSHADER_USAGE_FOG:
                    usage_str = "result.fogcoord";
                    break;
                case MOJOSHADER_USAGE_TEXCOORD:
                    snprintf(index_str, sizeof (index_str), "%u", (uint) index);
                    usage_str = "result.texcoord";
                    arrayleft = "[";
                    arrayright = "]";
                    break;
                default:
                    // !!! FIXME: we need to deal with some more built-in varyings here.
                    break;
            } // switch

            // !!! FIXME: the #define is a little hacky, but it means we don't
            // !!! FIXME:  have to track these separately if this works.
            push_output(ctx, &ctx->globals);
            // no mapping to built-in var? Just make it a regular global, pray.
            if (usage_str == NULL)
                output_line(ctx, "%s %s;", arb1_float_temp(ctx), varname);
            else
            {
                output_line(ctx, "OUTPUT %s = %s%s%s%s;", varname, usage_str,
                            arrayleft, index_str, arrayright);
            } // else
            pop_output(ctx);
        } // else if

        else
        {
            fail(ctx, "unknown vertex shader attribute register");
        } // else
    } // if

    else if (shader_is_pixel(ctx))
    {
        const char *paramtype_str = "ATTRIB";

        // samplers DCLs get handled in emit_ARB1_sampler().

        if (flags & MOD_CENTROID)
        {
            if (!support_nv4(ctx))  // GL_NV_fragment_program4 adds centroid.
            {
                // !!! FIXME: should we just wing it without centroid here?
                failf(ctx, "centroid unsupported in %s profile",
                      ctx->profile->name);
                return;
            } // if

            paramtype_str = "CENTROID ATTRIB";
        } // if

        if (regtype == REG_TYPE_COLOROUT)
        {
            paramtype_str = "OUTPUT";
            usage_str = "result.color";
            if (ctx->have_multi_color_outputs)
            {
                // We have to gamble that you have GL_ARB_draw_buffers.
                // You probably do at this point if you have a sane setup.
                snprintf(index_str, sizeof (index_str), "%u", (uint) regnum);
                arrayleft = "[";
                arrayright = "]";
            } // if
        } // if

        else if (regtype == REG_TYPE_DEPTHOUT)
        {
            paramtype_str = "OUTPUT";
            usage_str = "result.depth";
        } // else if

        // !!! FIXME: can you actualy have a texture register with COLOR usage?
        else if ((regtype == REG_TYPE_TEXTURE) || (regtype == REG_TYPE_INPUT))
        {
            if (usage == MOJOSHADER_USAGE_TEXCOORD)
            {
                // ps_1_1 does a different hack for this attribute.
                //  Refer to emit_ARB1_global()'s REG_TYPE_TEXTURE code.
                if (shader_version_atleast(ctx, 1, 4))
                {
                    snprintf(index_str, sizeof (index_str), "%u", (uint) index);
                    usage_str = "fragment.texcoord";
                    arrayleft = "[";
                    arrayright = "]";
                } // if
            } // if

            else if (usage == MOJOSHADER_USAGE_COLOR)
            {
                index_str[0] = '\0';  // no explicit number.
                if (index == 0)
                    usage_str = "fragment.color.primary";
                else if (index == 1)
                    usage_str = "fragment.color.secondary";
                else
                    fail(ctx, "unsupported color index");
            } // else if
        } // else if

        else if (regtype == REG_TYPE_MISCTYPE)
        {
            const MiscTypeType mt = (MiscTypeType) regnum;
            if (mt == MISCTYPE_TYPE_FACE)
            {
                if (support_nv4(ctx))  // FINALLY, a vFace equivalent in nv4!
                {
                    index_str[0] = '\0';  // no explicit number.
                    usage_str = "fragment.facing";
                } // if
                else
                {
                    failf(ctx, "vFace unsupported in %s profile",
                          ctx->profile->name);
                } // else
            } // if
            else if (mt == MISCTYPE_TYPE_POSITION)
            {
                index_str[0] = '\0';  // no explicit number.
                usage_str = "fragment.position";  // !!! FIXME: is this the same coord space as D3D?
            } // else if
            else
            {
                fail(ctx, "BUG: unhandled misc register");
            } // else
        } // else if

        else
        {
            fail(ctx, "unknown pixel shader attribute register");
        } // else

        if (usage_str != NULL)
        {
            push_output(ctx, &ctx->globals);
            output_line(ctx, "%s %s = %s%s%s%s;", paramtype_str, varname,
                        usage_str, arrayleft, index_str, arrayright);
            pop_output(ctx);
        } // if
    } // else if

    else
    {
        fail(ctx, "Unknown shader type");  // state machine should catch this.
    } // else
}